

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cxx
# Opt level: O2

void __thiscall
Matrix::Matrix(Matrix *this,double *data,shared_array<double> *parent,int *sizes,int dimension)

{
  allocator<char> local_31;
  
  Physical::Physical(&this->super_Physical);
  (this->super_Physical)._vptr_Physical = (_func_int **)&PTR__Matrix_00155750;
  (this->matrixParent).px = (double *)0x0;
  (this->matrixParent).pn.pi_ = (sp_counted_base *)0x0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&this->sMatrixName,"reference",&local_31);
  this->bReference = true;
  this->pData = data;
  boost::shared_array<double>::operator=(&this->matrixParent,parent);
  this->pSize = sizes;
  this->nMatrixDimension = dimension;
  init(this,(EVP_PKEY_CTX *)0x0);
  return;
}

Assistant:

Matrix::Matrix(double *data, shared_array<double> parent, int* sizes, int dimension) : sMatrixName("reference")
{
	bReference = true;
	pData = data;
	matrixParent = parent;
	pSize = sizes;
	nMatrixDimension = dimension;
	init(false);
}